

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O1

int __thiscall BoardView::LoadFile(BoardView *this,path *filepath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  BRDFileBase *file;
  long *plVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar7;
  FZFile *this_00;
  undefined4 extraout_var_04;
  shared_ptr<Pin> *p;
  vector<char,_std::allocator<char>_> buffer;
  path conffilepath;
  vector<char,_std::allocator<char>_> local_138;
  path local_120;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  path local_58;
  undefined4 extraout_var_03;
  
  this->m_lastFileOpenWasInvalid = true;
  this->m_validBoard = false;
  if ((filepath->_M_pathname)._M_string_length == 0) {
    return 1;
  }
  if ((this->m_file != (BRDFileBase *)0x0) && (this->m_board != (Board *)0x0)) {
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              (&this->m_pinHighlighted);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              (&this->m_partHighlighted);
    Annotations::Close(&this->m_annotations);
    iVar6 = (*this->m_board->_vptr_Board[2])();
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::clear
              ((vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_> *)
               CONCAT44(extraout_var,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[4])();
    std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::clear
              ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
               CONCAT44(extraout_var_00,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[3])();
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::clear
              ((vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_> *)
               CONCAT44(extraout_var_01,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[5])();
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::clear
              ((vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_> *)
               CONCAT44(extraout_var_02,iVar6));
    iVar6 = (*this->m_board->_vptr_Board[6])();
    plVar7 = (long *)CONCAT44(extraout_var_03,iVar6);
    if (plVar7[1] != *plVar7) {
      plVar7[1] = *plVar7;
    }
  }
  if (this->m_file != (BRDFileBase *)0x0) {
    (*this->m_file->_vptr_BRDFileBase[1])();
  }
  this->m_file = (BRDFileBase *)0x0;
  this->m_validBoard = false;
  (this->m_error_msg)._M_string_length = 0;
  *(this->m_error_msg)._M_dataplus._M_p = '\0';
  PDFBridgeEvince::CloseDocument(&this->pdfBridge);
  pcVar2 = (filepath->_M_pathname)._M_dataplus._M_p;
  paVar1 = &local_120._M_pathname.field_2;
  local_120._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,pcVar2,pcVar2 + (filepath->_M_pathname)._M_string_length);
  std::__cxx11::string::_M_assign((string *)&this->m_lastFileOpenName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_pathname._M_dataplus._M_p,
                    local_120._M_pathname.field_2._M_allocated_capacity + 1);
  }
  file_as_buffer(&local_138,filepath,&this->m_error_msg);
  if (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish) goto LAB_00112566;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,".fz","");
  bVar4 = check_fileext(filepath,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (bVar4) {
    this_00 = (FZFile *)operator_new(0x188);
    memset(this_00,0,0x188);
    BRDFileBase::BRDFileBase((BRDFileBase *)this_00);
    (this_00->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__FZFile_0022e490;
    memset(&this_00->partsDesc,0,200);
    FZFile::parse(this_00,&local_138,&(this->config).FZKey);
LAB_001123b9:
    this->m_file = &this_00->super_BRDFileBase;
  }
  else {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,".cae","");
    bVar4 = check_fileext(filepath,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0x188);
      memset(this_00,0,0x188);
      BRDFileBase::BRDFileBase((BRDFileBase *)this_00);
      memset(&this_00->partsDesc,0,200);
      (this_00->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__FZFile_0022e410;
      FZFile::parse(this_00,&local_138,&(this->config).CAEKey);
      goto LAB_001123b9;
    }
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,".bom","");
    bVar5 = check_fileext(filepath,&local_f8);
    bVar4 = true;
    if (!bVar5) {
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,".asc","");
      bVar4 = check_fileext(filepath,&local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4 != false) {
      this_00 = (FZFile *)operator_new(200);
      ASCFile::ASCFile((ASCFile *)this_00,&local_138,filepath);
      goto LAB_001123b9;
    }
    bVar4 = GenCADFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0x138);
      GenCADFile::GenCADFile((GenCADFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = ADFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0x110);
      ADFile::ADFile((ADFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = CADFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      CADFile::CADFile((CADFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,".cst","");
    bVar4 = check_fileext(filepath,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xe0);
      CSTFile::CSTFile((CSTFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = BRDFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      BRDFile::BRDFile((BRDFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = BRD2File::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      BRD2File::BRD2File((BRD2File *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = BDVFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      BDVFile::BDVFile((BDVFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = BVRFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      BVRFile::BVRFile((BVRFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = BVR3File::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      BVR3File::BVR3File((BVR3File *)this_00,&local_138);
      goto LAB_001123b9;
    }
    bVar4 = BRDAllegroFile::verifyFormat(&local_138);
    if (bVar4) {
      this_00 = (FZFile *)operator_new(0xc0);
      BRDAllegroFile::BRDAllegroFile((BRDAllegroFile *)this_00,&local_138);
      goto LAB_001123b9;
    }
    std::__cxx11::string::operator=((string *)&this->m_error_msg,"Unrecognized file format.");
  }
  file = this->m_file;
  if ((file != (BRDFileBase *)0x0) && (file->valid == true)) {
    LoadBoard(this,file);
    pcVar2 = (filepath->_M_pathname)._M_dataplus._M_p;
    local_120._M_pathname._M_dataplus._M_p = (pointer)&local_120._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,pcVar2,pcVar2 + (filepath->_M_pathname)._M_string_length);
    FHistory::Prepend_save(&this->fhistory,&local_120._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_pathname._M_dataplus._M_p != &local_120._M_pathname.field_2) {
      operator_delete(local_120._M_pathname._M_dataplus._M_p,
                      local_120._M_pathname.field_2._M_allocated_capacity + 1);
    }
    this->history_file_has_changed = 1;
    this->boardMinMaxDone = false;
    this->m_rotation = 0;
    this->m_current_side = 0;
    EPCCheck(this);
    pcVar2 = (filepath->_M_pathname)._M_dataplus._M_p;
    local_120._M_pathname._M_dataplus._M_p = (pointer)&local_120._M_pathname.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,pcVar2,pcVar2 + (filepath->_M_pathname)._M_string_length);
    Annotations::SetFilename(&this->m_annotations,&local_120._M_pathname);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_pathname._M_dataplus._M_p != &local_120._M_pathname.field_2) {
      operator_delete(local_120._M_pathname._M_dataplus._M_p,
                      local_120._M_pathname.field_2._M_allocated_capacity + 1);
    }
    Annotations::Load(&this->m_annotations);
    std::filesystem::__cxx11::path::path(&local_120,filepath);
    std::filesystem::__cxx11::path::path<char[5],std::filesystem::__cxx11::path>
              (&local_58,(char (*) [5])0x1f4eef,auto_format);
    std::filesystem::__cxx11::path::replace_extension(&local_120);
    std::filesystem::__cxx11::path::~path(&local_58);
    BackgroundImage::loadFromConfig(&this->backgroundImage,&local_120);
    PDFFile::loadFromConfig(&this->pdfFile,&local_120);
    PDFBridgeEvince::OpenDocument(&this->pdfBridge,&this->pdfFile);
    iVar6 = (*this->m_board->_vptr_Board[4])();
    plVar3 = (long *)((undefined8 *)CONCAT44(extraout_var_04,iVar6))[1];
    for (plVar7 = *(long **)CONCAT44(extraout_var_04,iVar6); plVar7 != plVar3; plVar7 = plVar7 + 2)
    {
      *(undefined4 *)(*plVar7 + 0x58) = 0x40e00000;
    }
    CenterView(this);
    this->m_lastFileOpenWasInvalid = false;
    this->m_validBoard = true;
    (this->m_error_msg)._M_string_length = 0;
    *(this->m_error_msg)._M_dataplus._M_p = '\0';
    std::filesystem::__cxx11::path::~path(&local_120);
  }
LAB_00112566:
  if (local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int BoardView::LoadFile(const filesystem::path &filepath) {
	m_lastFileOpenWasInvalid = true;
	m_validBoard             = false;
	if (!filepath.empty()) {
		// clean up the previous file.
		if (m_file && m_board) {
			m_pinHighlighted.clear();
			m_partHighlighted.clear();
			m_annotations.Close();
			m_board->Nets().clear();
			m_board->Pins().clear();
			m_board->Components().clear();
			m_board->OutlinePoints().clear();
			m_board->OutlineSegments().clear();
			//	delete m_file;
			// delete m_board;
		}
		delete m_file;
		m_file = nullptr;
		m_validBoard = false;
		m_error_msg.clear();
		pdfBridge.CloseDocument();

		SetLastFileOpenName(filepath.string());
		std::vector<char> buffer = file_as_buffer(filepath, m_error_msg);
		if (!buffer.empty()) {
			if (check_fileext(filepath, ".fz")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				FZFile *fzfile = new FZFile();
				fzfile->parse(buffer, config.FZKey);
				m_file = fzfile;
			} else if (check_fileext(filepath, ".cae")) { // Since it is encrypted we cannot use the below logic. Trust the ext.
				CAEFile *caefile = new CAEFile();
				caefile->parse(buffer, config.CAEKey);
				m_file = caefile;
			} else if (check_fileext(filepath, ".bom") || check_fileext(filepath, ".asc"))
				m_file = new ASCFile(buffer, filepath);
			else if (GenCADFile::verifyFormat(buffer))
				m_file = new GenCADFile(buffer);
			else if (ADFile::verifyFormat(buffer))
				m_file = new ADFile(buffer);
			else if (CADFile::verifyFormat(buffer))
				m_file = new CADFile(buffer);
			else if (check_fileext(filepath, ".cst"))
				m_file = new CSTFile(buffer);
			else if (BRDFile::verifyFormat(buffer))
				m_file = new BRDFile(buffer);
			else if (BRD2File::verifyFormat(buffer))
				m_file = new BRD2File(buffer);
			else if (BDVFile::verifyFormat(buffer))
				m_file = new BDVFile(buffer);
			else if (BVRFile::verifyFormat(buffer))
				m_file = new BVRFile(buffer);
			else if (BVR3File::verifyFormat(buffer))
				m_file = new BVR3File(buffer);
			else if (BRDAllegroFile::verifyFormat(buffer))
				m_file = new BRDAllegroFile(buffer);
			else
				m_error_msg = "Unrecognized file format.";

			if (m_file && m_file->valid) {
				LoadBoard(m_file);
				fhistory.Prepend_save(filepath.string());
				history_file_has_changed = 1; // used by main to know when to update the window title
				boardMinMaxDone          = false;
				m_rotation               = 0;
				m_current_side           = 0;
				EPCCheck(); // check to see we don't have a flipped board outline

				m_annotations.SetFilename(filepath.string());
				m_annotations.Load();

				auto conffilepath = filepath;
				conffilepath.replace_extension("conf");
				backgroundImage.loadFromConfig(conffilepath);
				pdfFile.loadFromConfig(conffilepath);

				pdfBridge.OpenDocument(pdfFile);

				/*
				 * Set pins to a known lower size, they get resized
				 * in DrawParts() when the component is analysed
				 */
				for (auto &p : m_board->Pins()) {
					//					auto p      = pin.get();
					p->diameter = 7;
				}

				CenterView();
				m_lastFileOpenWasInvalid = false;
				m_validBoard             = true;
				m_error_msg.clear();
			}
		}
	} else {
		return 1;
	}

	return 0;
}